

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O3

Color __thiscall TRM::Color::blend(Color *this,Color *src)

{
  byte bVar1;
  char cVar2;
  float fVar3;
  
  bVar1 = (src->fRGBA)._M_elems[3];
  fVar3 = (float)bVar1 / -255.0 + 1.0;
  cVar2 = (char)(int)((float)(this->fRGBA)._M_elems[1] * fVar3);
  return (array<unsigned_char,_4UL>)
         (array<unsigned_char,_4UL>)
         ((uint)(byte)((char)(int)((float)(this->fRGBA)._M_elems[0] * fVar3) +
                      (src->fRGBA)._M_elems[0]) |
         (uint)(byte)((src->fRGBA)._M_elems[1] + cVar2) << 8 |
         (uint)(byte)(cVar2 + (src->fRGBA)._M_elems[2]) << 0x10 |
         (uint)(byte)((char)(int)((float)(this->fRGBA)._M_elems[3] * fVar3) + bVar1) << 0x18);
}

Assistant:

Color Color::blend(const Color& src) const {
  float alpha = float(src.fRGBA[color_A]) / 255.f;
  float one_minus_alpha = 1.f - alpha;

  uint8_t r =
      src.fRGBA[color_R] + uint8_t(this->fRGBA[color_R] * one_minus_alpha);
  uint8_t g =
      src.fRGBA[color_G] + uint8_t(this->fRGBA[color_G] * one_minus_alpha);
  uint8_t b =
      src.fRGBA[color_B] + uint8_t(this->fRGBA[color_G] * one_minus_alpha);
  uint8_t a =
      src.fRGBA[color_A] + uint8_t(this->fRGBA[color_A] * one_minus_alpha);

  return Color(r, g, b, a);
}